

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::filterTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__
                  ,vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  pointer __x;
  
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
            (__return_storage_ptr__,
             ((long)(testCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(testCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5075075075075075);
  pTVar1 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (__x = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
             _M_impl.super__Vector_impl_data._M_start; __x != pTVar1; __x = __x + 1) {
    bVar2 = TestSpec::matches(testSpec,&__x->super_TestCaseInfo);
    if (bVar2) {
      iVar3 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(config);
      if (((char)iVar3 != '\0') || (((__x->super_TestCaseInfo).properties & Throws) == None)) {
        std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                  (__return_storage_ptr__,__x);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCase> filterTests(std::vector<TestCase> const& testCases, TestSpec const& testSpec, IConfig const& config) {
		std::vector<TestCase> filtered;
		filtered.reserve(testCases.size());
		for (std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
			it != itEnd;
			++it)
			if (matchTest(*it, testSpec, config))
				filtered.push_back(*it);
		return filtered;
	}